

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O1

int SUNLinSolSolve_Band(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype tol)

{
  void *pvVar1;
  int iVar2;
  realtype **a;
  realtype *b_00;
  void *pvVar3;
  undefined8 uVar4;
  
  iVar2 = -1;
  if ((b != (N_Vector)0x0 && x != (N_Vector)0x0) &&
      (S != (SUNLinearSolver)0x0 && A != (SUNMatrix)0x0)) {
    N_VScale(1.0,b,x);
    a = SUNBandMatrix_Cols(A);
    b_00 = N_VGetArrayPointer(x);
    pvVar3 = S->content;
    if (*(sunindextype **)((long)pvVar3 + 8) == (sunindextype *)0x0 ||
        (b_00 == (realtype *)0x0 || a == (realtype **)0x0)) {
      iVar2 = -3;
      uVar4 = 0xfffffffffffffffd;
    }
    else {
      pvVar1 = A->content;
      bandGBTRS(a,*(sunindextype *)((long)pvVar1 + 8),*(sunindextype *)((long)pvVar1 + 0x28),
                *(sunindextype *)((long)pvVar1 + 0x20),*(sunindextype **)((long)pvVar3 + 8),b_00);
      pvVar3 = S->content;
      uVar4 = 0;
      iVar2 = 0;
    }
    *(undefined8 *)((long)pvVar3 + 0x10) = uVar4;
  }
  return iVar2;
}

Assistant:

int SUNLinSolSolve_Band(SUNLinearSolver S, SUNMatrix A, N_Vector x, 
                        N_Vector b, realtype tol)
{
  realtype **A_cols, *xdata;
  sunindextype *pivots;
  
  /* check for valid inputs */
  if ( (A == NULL) || (S == NULL) || (x == NULL) || (b == NULL) ) 
    return(SUNLS_MEM_NULL);
  
  /* copy b into x */
  N_VScale(ONE, b, x);

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  xdata = NULL;
  pivots = NULL;
  A_cols = SUNBandMatrix_Cols(A);
  xdata = N_VGetArrayPointer(x);
  pivots = PIVOTS(S);
  if ( (A_cols == NULL) || (xdata == NULL)  || (pivots == NULL) ) {
    LASTFLAG(S) = SUNLS_MEM_FAIL;
    return(LASTFLAG(S));
  }

  /* solve using LU factors */
  bandGBTRS(A_cols, SM_COLUMNS_B(A), SM_SUBAND_B(A), 
            SM_LBAND_B(A), pivots, xdata);
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}